

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::~PosixWritableFile(PosixWritableFile *this)

{
  undefined1 local_18 [16];
  PosixWritableFile *this_local;
  
  local_18._8_8_ = this;
  if (-1 < this->fd_) {
    Close((PosixWritableFile *)local_18);
    Status::~Status((Status *)local_18);
  }
  std::__cxx11::string::~string((string *)&this->dirname_);
  std::__cxx11::string::~string((string *)&this->filename_);
  WritableFile::~WritableFile(&this->super_WritableFile);
  return;
}

Assistant:

~PosixWritableFile() override {
    if (fd_ >= 0) {
      // Ignoring any potential errors
      Close();
    }
  }